

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixserver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  LogUnixServer *this;
  long *local_40 [2];
  long local_30 [2];
  
  this = (LogUnixServer *)operator_new(0x80);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/tmp/TestLogServer","");
  liblogger::LogUnixServer::LogUnixServer(this,(string *)local_40);
  liblogger::LogManager::Add((ILogger *)this);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  sleep(2);
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogUnixServer("/tmp/TestLogServer"));

	sleep(2);

	examples();

	LogManager::RemoveAll();
	return 0;
}